

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS
ref_gather_brick_tec
          (REF_NODE ref_node,REF_CELL ref_cell,REF_LONG ncell_expected,REF_GLOB *l2c,REF_BOOL binary
          ,FILE *file)

{
  REF_GLOB *pRVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  REF_STATUS RVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  void *pvVar8;
  long lVar9;
  undefined8 uVar10;
  ulong uVar11;
  long lVar12;
  REF_MPI ref_mpi;
  undefined4 in_register_00000084;
  char *pcVar13;
  size_t sVar14;
  int iVar15;
  int cell;
  REF_INT source;
  REF_INT ncell;
  REF_INT part;
  int int_node_1;
  REF_GLOB globals [27];
  REF_INT nodes [27];
  int local_208;
  int local_204;
  ulong local_200;
  void *local_1f8;
  REF_MPI local_1f0;
  REF_NODE local_1e8;
  size_t local_1e0;
  REF_GLOB local_1d8 [2];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined4 local_194;
  size_t local_190;
  REF_GLOB local_188 [2];
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 local_150;
  REF_INT local_a8 [30];
  
  local_1f0 = ref_node->ref_mpi;
  uVar5 = ref_cell->node_per;
  local_200 = (ulong)uVar5;
  iVar15 = ref_cell->max;
  local_1e8 = ref_node;
  local_190 = ncell_expected;
  if (local_1f0->id == 0) {
    cell = 0;
    if (iVar15 < 1) {
      local_1e0 = 0;
    }
    else {
      local_1e0 = 0;
      do {
        RVar4 = ref_cell_nodes(ref_cell,cell,local_a8);
        if (RVar4 != 0) goto LAB_00144a22;
        uVar5 = ref_cell_part(ref_cell,local_1e8,cell,&local_204);
        if (uVar5 != 0) {
          pcVar13 = "part";
          uVar10 = 0x209;
          goto LAB_00144fda;
        }
        if (local_1f0->id != local_204) goto LAB_00144a22;
        if (0 < (int)local_200) {
          uVar6 = 0;
          do {
            local_188[uVar6] = l2c[local_a8[uVar6]];
            uVar6 = uVar6 + 1;
          } while (local_200 != uVar6);
        }
        switch(ref_cell->node_per) {
        case 4:
          local_1d8[0] = local_188[0];
          local_1d8[1] = local_188[1];
          local_1a0 = CONCAT44(uStack_16c,uStack_170);
          uStack_1b0 = local_1a0;
          goto LAB_001449df;
        case 5:
          local_1d8[0] = local_188[0];
          local_1d8[1] = local_188[1];
          local_1b8 = CONCAT44(uStack_16c,uStack_170);
          uStack_1b0 = local_168;
          uStack_1c0 = CONCAT44(uStack_174,local_178);
          local_1a8 = local_168;
          local_1a0 = CONCAT44(uStack_16c,uStack_170);
          break;
        case 6:
          local_1d8[0] = local_188[0];
          local_1d8[1] = local_188[1];
          uStack_1b0 = local_168;
          local_1a0 = uStack_160;
LAB_001449df:
          local_1b8 = CONCAT44(uStack_16c,uStack_170);
          uStack_1c0 = CONCAT44(uStack_174,local_178);
          local_1a8 = local_1a0;
          break;
        default:
          uVar10 = 0x21c;
LAB_00145046:
          uVar5 = 6;
          pcVar13 = "wrong nodes per cell";
          uVar6 = 6;
          goto LAB_00144fdd;
        case 8:
          local_1d8[0] = local_188[0];
          local_1d8[1] = local_188[1];
          uStack_1c0 = CONCAT44(uStack_16c,uStack_170);
          local_1b8 = local_168;
          uStack_1b0 = uStack_160;
          local_1a8 = local_158;
          local_1a0 = local_150;
        }
        local_1c8 = CONCAT44(uStack_174,local_178);
        local_1d8[1] = local_188[1];
        local_1d8[0] = local_188[0];
        lVar12 = 0;
        do {
          local_208 = (int)local_1d8[lVar12];
          sVar7 = fwrite(&local_208,4,1,(FILE *)CONCAT44(in_register_00000084,binary));
          if (sVar7 != 1) {
            pcVar13 = "int c2n";
            sVar14 = 1;
            uVar10 = 0x223;
            goto LAB_00144ee5;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != 8);
        local_1e0 = local_1e0 + 1;
LAB_00144a22:
        uVar5 = (uint)local_200;
        cell = cell + 1;
        iVar15 = ref_cell->max;
      } while (cell < iVar15);
      if (local_1f0->id != 0) goto LAB_0014478a;
    }
    ref_mpi = local_1f0;
    if (local_1f0->n < 2) {
LAB_00144e9e:
      if (ref_mpi->id != 0) {
        return 0;
      }
      if (local_1e0 == local_190) {
        return 0;
      }
      pcVar13 = "cell count mismatch";
      uVar10 = 0x274;
      sVar14 = local_190;
      sVar7 = local_1e0;
LAB_00144ee5:
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar10,"ref_gather_brick_tec",pcVar13,sVar14,sVar7);
    }
    else {
      local_1f8 = (void *)(long)(int)uVar5;
      source = 1;
      while( true ) {
        uVar5 = ref_mpi_gather_recv(ref_mpi,&local_208,1,1,source);
        if (uVar5 != 0) {
          pcVar13 = "recv ncell";
          uVar10 = 0x234;
          goto LAB_00144fda;
        }
        uVar5 = local_208 * (int)local_200;
        if ((int)uVar5 < 0) break;
        local_1e8 = (REF_NODE)CONCAT44(local_1e8._4_4_,source);
        pvVar8 = malloc((ulong)uVar5 << 3);
        if (pvVar8 == (void *)0x0) {
          uVar10 = 0x235;
          goto LAB_00144e3f;
        }
        uVar5 = ref_mpi_gather_recv(ref_mpi,pvVar8,uVar5,2,(REF_INT)local_1e8);
        if (uVar5 != 0) {
          pcVar13 = "recv c2n";
          uVar10 = 0x238;
          goto LAB_00144fda;
        }
        if (0 < local_208) {
          lVar12 = 0;
          do {
            switch(ref_cell->node_per) {
            case 4:
              lVar9 = lVar12 * (long)local_1f8;
              pRVar1 = (REF_GLOB *)((long)pvVar8 + lVar9 * 8);
              local_1d8[0] = *pRVar1;
              local_1d8[1] = pRVar1[1];
              local_1c8 = *(undefined8 *)((long)pvVar8 + lVar9 * 8 + 0x10);
              uStack_1c0 = local_1c8;
              local_1a0 = *(undefined8 *)((long)pvVar8 + lVar9 * 8 + 0x18);
              local_1b8 = local_1a0;
              uStack_1b0 = local_1a0;
              goto LAB_00144d1b;
            case 5:
              lVar9 = lVar12 * (long)local_1f8;
              pRVar1 = (REF_GLOB *)((long)pvVar8 + lVar9 * 8);
              local_1d8[0] = *pRVar1;
              local_1d8[1] = pRVar1[1];
              puVar3 = (undefined8 *)((long)pvVar8 + lVar9 * 8 + 0x10);
              puVar2 = (undefined8 *)((long)pvVar8 + lVar9 * 8 + 0x18);
              local_1a0 = *(undefined8 *)((long)pvVar8 + lVar9 * 8 + 0x18);
              local_1b8 = *puVar2;
              uStack_1b0 = puVar2[1];
              local_1c8 = *puVar3;
              uStack_1c0 = *puVar3;
              local_1a8 = *(undefined8 *)((long)pvVar8 + lVar9 * 8 + 0x20);
              break;
            case 6:
              lVar9 = lVar12 * (long)local_1f8;
              pRVar1 = (REF_GLOB *)((long)pvVar8 + lVar9 * 8);
              local_1d8[0] = *pRVar1;
              local_1d8[1] = pRVar1[1];
              puVar3 = (undefined8 *)((long)pvVar8 + lVar9 * 8 + 0x10);
              local_1c8 = *puVar3;
              uStack_1c0 = local_1c8;
              local_1b8 = puVar3[1];
              uStack_1b0 = *(undefined8 *)((long)pvVar8 + lVar9 * 8 + 0x20);
              local_1a0 = *(undefined8 *)((long)pvVar8 + lVar9 * 8 + 0x28);
LAB_00144d1b:
              local_1a8 = local_1a0;
              local_1c8 = uStack_1c0;
              break;
            default:
              uVar10 = 0x248;
              goto LAB_00145046;
            case 8:
              lVar9 = lVar12 * (long)local_1f8;
              pRVar1 = (REF_GLOB *)((long)pvVar8 + lVar9 * 8);
              local_1d8[0] = *pRVar1;
              local_1d8[1] = pRVar1[1];
              puVar3 = (undefined8 *)((long)pvVar8 + lVar9 * 8 + 0x10);
              local_1c8 = *puVar3;
              uStack_1c0 = puVar3[1];
              puVar3 = (undefined8 *)((long)pvVar8 + lVar9 * 8 + 0x20);
              local_1b8 = *puVar3;
              uStack_1b0 = puVar3[1];
              local_1a8 = *(undefined8 *)((long)pvVar8 + lVar9 * 8 + 0x30);
              local_1a0 = *(undefined8 *)((long)pvVar8 + lVar9 * 8 + 0x38);
            }
            lVar9 = 0;
            do {
              local_194 = (undefined4)local_1d8[lVar9];
              sVar7 = fwrite(&local_194,4,1,(FILE *)CONCAT44(in_register_00000084,binary));
              if (sVar7 != 1) {
                pcVar13 = "int c2n";
                sVar14 = 1;
                uVar10 = 0x24f;
                goto LAB_00144ee5;
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 != 8);
            local_1e0 = local_1e0 + 1;
            lVar12 = lVar12 + 1;
            ref_mpi = local_1f0;
          } while (lVar12 < local_208);
        }
        free(pvVar8);
        source = (REF_INT)local_1e8 + 1;
        if (ref_mpi->n <= source) goto LAB_00144e9e;
      }
      uVar10 = 0x235;
LAB_00144de2:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar10,"ref_gather_brick_tec","malloc c2n of REF_GLOB negative");
    }
    uVar5 = 1;
  }
  else {
    local_1e0 = 0;
LAB_0014478a:
    local_208 = 0;
    if (0 < iVar15) {
      iVar15 = 0;
      do {
        RVar4 = ref_cell_nodes(ref_cell,iVar15,local_a8);
        if (RVar4 == 0) {
          uVar5 = ref_cell_part(ref_cell,local_1e8,iVar15,&local_204);
          if (uVar5 != 0) {
            pcVar13 = "part";
            uVar10 = 0x25f;
            goto LAB_00144fda;
          }
          if (local_1f0->id == local_204) {
            local_208 = local_208 + 1;
          }
        }
        iVar15 = iVar15 + 1;
      } while (iVar15 < ref_cell->max);
    }
    ref_mpi = local_1f0;
    uVar5 = ref_mpi_gather_send(local_1f0,&local_208,1,1);
    if (uVar5 == 0) {
      if (local_208 * (int)local_200 < 0) {
        uVar10 = 0x263;
        goto LAB_00144de2;
      }
      pvVar8 = malloc((ulong)(uint)(local_208 * (int)local_200) << 3);
      if (pvVar8 == (void *)0x0) {
        uVar10 = 0x263;
LAB_00144e3f:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar10,"ref_gather_brick_tec","malloc c2n of REF_GLOB NULL");
        return 2;
      }
      local_208 = 0;
      if (ref_cell->max < 1) {
        iVar15 = (int)local_200;
      }
      else {
        uVar6 = local_200 & 0xffffffff;
        iVar15 = 0;
        local_1f8 = pvVar8;
        do {
          RVar4 = ref_cell_nodes(ref_cell,iVar15,local_a8);
          if (RVar4 == 0) {
            uVar5 = ref_cell_part(ref_cell,local_1e8,iVar15,&local_204);
            if (uVar5 != 0) {
              pcVar13 = "part";
              uVar10 = 0x266;
              goto LAB_00144fda;
            }
            if (local_1f0->id == local_204) {
              if (0 < (int)local_200) {
                uVar11 = 0;
                do {
                  *(REF_GLOB *)
                   ((long)local_1f8 + uVar11 * 8 + (long)(local_208 * (int)local_200) * 8) =
                       l2c[local_a8[uVar11]];
                  uVar11 = uVar11 + 1;
                } while (uVar6 != uVar11);
              }
              local_208 = local_208 + 1;
            }
          }
          iVar15 = iVar15 + 1;
        } while (iVar15 < ref_cell->max);
        iVar15 = (int)local_200;
        ref_mpi = local_1f0;
        pvVar8 = local_1f8;
      }
      uVar5 = ref_mpi_gather_send(ref_mpi,pvVar8,local_208 * iVar15,2);
      if (uVar5 == 0) {
        free(pvVar8);
        goto LAB_00144e9e;
      }
      pcVar13 = "send c2n";
      uVar10 = 0x26e;
    }
    else {
      pcVar13 = "send ncell";
      uVar10 = 0x262;
    }
LAB_00144fda:
    uVar6 = (ulong)uVar5;
LAB_00144fdd:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar10
           ,"ref_gather_brick_tec",uVar6,pcVar13);
  }
  return uVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_brick_tec(REF_NODE ref_node,
                                               REF_CELL ref_cell,
                                               REF_LONG ncell_expected,
                                               REF_GLOB *l2c, REF_BOOL binary,
                                               FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT cell, node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB brick[8];
  REF_GLOB globals[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per = ref_cell_node_per(ref_cell);
  REF_GLOB *c2n;
  REF_INT proc, part, ncell;
  REF_LONG ncell_actual;

  ncell_actual = 0;

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        for (node = 0; node < node_per; node++) {
          globals[node] = l2c[nodes[node]];
        }
        switch (ref_cell_node_per(ref_cell)) {
          case 4:
            REF_CELL_TEC_BRICK_TET(brick, globals);
            break;
          case 5:
            REF_CELL_TEC_BRICK_PYR(brick, globals);
            break;
          case 6:
            REF_CELL_TEC_BRICK_PRI(brick, globals);
            break;
          case 8:
            REF_CELL_TEC_BRICK_HEX(brick, globals);
            break;
          default:
            RSS(REF_IMPLEMENT, "wrong nodes per cell");
            break;
        }
        if (binary) {
          for (node = 0; node < 8; node++) {
            int int_node;
            int_node = (int)brick[node]; /* binary zero-based */
            REIS(1, fwrite(&int_node, sizeof(int), 1, file), "int c2n");
          }
        } else {
          for (node = 0; node < 8; node++) {
            brick[node]++; /* ascii one-based */
            fprintf(file, " " REF_GLOB_FMT, brick[node]);
          }
          fprintf(file, "\n");
        }
        ncell_actual++;
      }
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell, 1, REF_INT_TYPE, proc),
          "recv ncell");
      ref_malloc(c2n, ncell * node_per, REF_GLOB);
      RSS(ref_mpi_gather_recv(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE,
                              proc),
          "recv c2n");
      for (cell = 0; cell < ncell; cell++) {
        switch (ref_cell_node_per(ref_cell)) {
          case 4:
            REF_CELL_TEC_BRICK_TET(brick, &(c2n[node_per * cell]));
            break;
          case 5:
            REF_CELL_TEC_BRICK_PYR(brick, &(c2n[node_per * cell]));
            break;
          case 6:
            REF_CELL_TEC_BRICK_PRI(brick, &(c2n[node_per * cell]));
            break;
          case 8:
            REF_CELL_TEC_BRICK_HEX(brick, &(c2n[node_per * cell]));
            break;
          default:
            RSS(REF_IMPLEMENT, "wrong nodes per cell");
            break;
        }
        if (binary) {
          for (node = 0; node < 8; node++) {
            int int_node;
            int_node = (int)brick[node]; /* binary zero-based */
            REIS(1, fwrite(&int_node, sizeof(int), 1, file), "int c2n");
          }
        } else {
          for (node = 0; node < 8; node++) {
            brick[node]++; /* ascii one-based */
            fprintf(file, " " REF_GLOB_FMT, brick[node]);
          }
          fprintf(file, "\n");
        }
        ncell_actual++;
      }
      ref_free(c2n);
    }
  } else {
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) ncell++;
    }
    RSS(ref_mpi_gather_send(ref_mpi, &ncell, 1, REF_INT_TYPE), "send ncell");
    ref_malloc(c2n, ncell * node_per, REF_GLOB);
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        for (node = 0; node < node_per; node++)
          c2n[node + node_per * ncell] = l2c[nodes[node]];
        ncell++;
      }
    }
    RSS(ref_mpi_gather_send(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE),
        "send c2n");

    ref_free(c2n);
  }

  if (ref_mpi_once(ref_mpi)) {
    REIS(ncell_expected, ncell_actual, "cell count mismatch");
  }

  return REF_SUCCESS;
}